

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db.h
# Opt level: O3

bool __thiscall
wallet::DatabaseBatch::Erase<std::pair<std::__cxx11::string,CScript>>
          (DatabaseBatch *this,
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CScript>
          *key)

{
  int iVar1;
  long in_FS_OFFSET;
  DataStream local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38.m_read_pos = 0;
  local_38.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<std::byte,_zero_after_free_allocator<std::byte>_>::reserve(&local_38.vch,1000);
  Serialize<DataStream,char>(&local_38,&key->first);
  SerializeMany<DataStream,prevector<28u,unsigned_char,unsigned_int,int>>
            (&local_38,&(key->second).super_CScriptBase);
  iVar1 = (*this->_vptr_DatabaseBatch[2])(this,&local_38);
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return SUB41(iVar1,0);
  }
  __stack_chk_fail();
}

Assistant:

bool Erase(const K& key)
    {
        DataStream ssKey{};
        ssKey.reserve(1000);
        ssKey << key;

        return EraseKey(std::move(ssKey));
    }